

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_ht_test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ulong uVar2;
  result_type rVar3;
  reference puVar4;
  ostream *poVar5;
  rep rVar6;
  size_t sVar7;
  pair<const_unsigned_long,_unsigned_long> pVar8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a28;
  duration<long,_std::ratio<1L,_1000L>_> local_a20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a18;
  duration<long,_std::ratio<1L,_1000L>_> local_a10;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a08;
  duration<long,_std::ratio<1L,_1000L>_> local_a00;
  duration<long,_std::ratio<1L,_1000000000L>_> local_9f8;
  duration<long,_std::ratio<1L,_1000L>_> local_9f0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_9e8;
  time_point t5;
  unsigned_long *i_4;
  iterator __end1_4;
  iterator __begin1_4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_4;
  time_point t4;
  unsigned_long *i_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_3;
  time_point t3;
  unsigned_long *i_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_2;
  time_point t2;
  unsigned_long *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  time_point t1;
  unsigned_long *i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  size_t right3;
  size_t right2;
  size_t right;
  uniform_int_distribution<unsigned_long> dis;
  duration<long,_std::ratio<1L,_1000000000L>_> local_8d0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_8c8;
  default_random_engine en;
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  bht;
  allocator<unsigned_long> local_31;
  value_type_conflict local_30;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> keys;
  
  keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_30 = 0;
  std::allocator<unsigned_long>::allocator(&local_31);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,10000000,&local_30,
             &local_31);
  std::allocator<unsigned_long>::~allocator(&local_31);
  neatlib::
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  ::BasicHashTable((BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
                    *)&en);
  dis._M_param._M_b = std::chrono::_V2::steady_clock::now();
  local_8d0.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&dis._M_param._M_b);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_8d0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_8c8,uVar2 & 0xffffffff);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&right,0,20000000);
  right2 = 0;
  right3 = 0;
  __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  i = (unsigned_long *)
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&i), bVar1) {
    t1.__d.__r = (duration)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end1);
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)&right,&local_8c8);
    *(result_type *)t1.__d.__r = rVar3;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  __range1_1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::chrono::_V2::steady_clock::now();
  __end1_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  i_1 = (unsigned_long *)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)&i_1), bVar1) {
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1_1);
    t2.__d.__r = (duration)10;
    neatlib::
    BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
    ::Insert((BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
              *)&en,puVar4,(unsigned_long *)&t2);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1_1);
  }
  __range1_2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::chrono::_V2::steady_clock::now();
  __end1_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  i_2 = (unsigned_long *)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)&i_2), bVar1) {
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1_2);
    pVar8 = neatlib::
            BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
            ::Get((BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
                   *)&en,puVar4);
    t3.__d.__r = (duration)pVar8.first;
    if (pVar8.second == 10) {
      right2 = right2 + 1;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1_2);
  }
  __range1_3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::chrono::_V2::steady_clock::now();
  __end1_3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  i_3 = (unsigned_long *)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)&i_3), bVar1) {
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1_3);
    t4.__d.__r = (duration)0x14;
    bVar1 = neatlib::
            BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
            ::Update((BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
                      *)&en,puVar4,(unsigned_long *)&t4);
    if (bVar1) {
      right3 = right3 + 1;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1_3);
  }
  __range1_4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::chrono::_V2::steady_clock::now();
  __end1_4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  i_4 = (unsigned_long *)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_4,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)&i_4), bVar1) {
    t5.__d.__r = (duration)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end1_4);
    bVar1 = neatlib::
            BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
            ::Remove((BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
                      *)&en,(unsigned_long *)t5.__d.__r);
    if (bVar1) {
      __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1_4);
  }
  local_9e8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  poVar5 = std::operator<<((ostream *)&std::cout,"INSERTION TIME: ");
  local_9f8.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1_2,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1_1);
  local_9f0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_9f8);
  rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_9f0);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar6);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"GETTING TIME:   ");
  local_a08.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1_3,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1_2);
  local_a00.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_a08);
  rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_a00);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar6);
  poVar5 = std::operator<<(poVar5,"  ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,right2);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"UPDATING TIME:  ");
  local_a18.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1_4,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1_3);
  local_a10.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_a18);
  rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_a10);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar6);
  poVar5 = std::operator<<(poVar5,"  ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,right3);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"REMOVING TIME:  ");
  local_a28.__r =
       (rep)std::chrono::operator-
                      (&local_9e8,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1_4);
  local_a20.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_a28);
  rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_a20);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar6);
  poVar5 = std::operator<<(poVar5,"  ");
  sVar7 = neatlib::
          BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
          ::Size((BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
                  *)&en);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
  poVar5 = std::operator<<(poVar5,"  ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)__range1);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  neatlib::
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  ::~BasicHashTable((BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
                     *)&en);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  return keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    vector<size_t> keys(TOTAL_ELEMENTS, 0);
    neatlib::BasicHashTable<size_t,
                              size_t,
                              std::hash<size_t>,
                              std::equal_to<size_t>,
                              std::allocator<std::pair<const size_t, size_t>>,
                              8> bht;
    default_random_engine en(static_cast<unsigned int>(steady_clock::now().time_since_epoch().count()));
    uniform_int_distribution<size_t> dis(0, RANGE);
    std::size_t right = 0, right2 = 0, right3 = 0;
    for (auto &i : keys) i = dis(en);

    auto t1 = steady_clock::now();
    for (const auto &i : keys)
        bht.Insert(i, 10);
    auto t2 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Get(i).second == 10)
            ++right;

    auto t3 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Update(i, 20))
            ++right2;
    auto t4 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Remove(i))
            ++right3;

    auto t5 = steady_clock::now();

    cout << "INSERTION TIME: " << duration_cast<milliseconds>(t2 - t1).count() << endl;
    cout << "GETTING TIME:   " << duration_cast<milliseconds>(t3 - t2).count() << "  " << right << endl;
    cout << "UPDATING TIME:  " << duration_cast<milliseconds>(t4 - t3).count() << "  " << right2 << endl;
    cout << "REMOVING TIME:  " << duration_cast<milliseconds>(t5 - t4).count() << "  " << bht.Size() << "  "
         << right3 << endl;

}